

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

Options * default_options(void)

{
  Options *in_RDI;
  
  in_RDI->width = 200;
  in_RDI->height = 200;
  in_RDI->max_samples = -1;
  in_RDI->max_seconds = -1;
  in_RDI->output_file = (char *)0x0;
  in_RDI->uniform_sampling = false;
  return in_RDI;
}

Assistant:

Options default_options() {
    return (Options) {
        .width = 200,
            .height = 200,
            .output_file = NULL,
            .max_samples = -1,
            .max_seconds = -1,
            .uniform_sampling = false
            };
}